

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index shift)

{
  Builder *this_00;
  LocalGet *left;
  LocalGet *right;
  Binary *value;
  LocalSet *any;
  Const *append;
  Block *pBVar1;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  left = Builder::makeLocalGet(this_00,leftLow,(Type)0x2);
  right = Builder::makeLocalGet
                    ((this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,shift,(Type)0x2);
  value = Builder::makeBinary(this_00,ShlInt32,(Expression *)left,(Expression *)right);
  any = Builder::makeLocalSet(this_00,highBits,(Expression *)value);
  append = Builder::makeConst<int>
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
  pBVar1 = Builder::blockify(this_00,(Expression *)any,(Expression *)append);
  return pBVar1;
}

Assistant:

Block* makeLargeShl(Index highBits, Index leftLow, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShlInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeConst(int32_t(0)));
  }